

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::String::padEnd(String *this,size_t n,char c)

{
  ulong uVar1;
  char *__s;
  size_t size;
  Error EVar2;
  
  uVar1 = (ulong)(byte)*this;
  if (0x1e < uVar1) {
    uVar1 = *(ulong *)(this + 8);
  }
  EVar2 = 0;
  size = n - uVar1;
  if (uVar1 <= n && size != 0) {
    EVar2 = 1;
    __s = prepare(this,kAppend,size);
    if (__s != (char *)0x0) {
      memset(__s,(uint)(byte)c,size);
      EVar2 = 0;
    }
  }
  return EVar2;
}

Assistant:

Error String::padEnd(size_t n, char c) noexcept {
  size_t size = this->size();
  return n > size ? appendChars(c, n - size) : kErrorOk;
}